

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coincontrol.cpp
# Opt level: O0

bool __thiscall wallet::CCoinControl::IsExternalSelected(CCoinControl *this,COutPoint *outpoint)

{
  long lVar1;
  bool bVar2;
  _Self *in_RDI;
  long in_FS_OFFSET;
  const_iterator it;
  PreselectedInput *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  bool local_29;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  map<COutPoint,_wallet::PreselectedInput,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_wallet::PreselectedInput>_>_>
  ::find((map<COutPoint,_wallet::PreselectedInput,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_wallet::PreselectedInput>_>_>
          *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
         (key_type *)in_stack_ffffffffffffffb8);
  std::
  map<COutPoint,_wallet::PreselectedInput,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_wallet::PreselectedInput>_>_>
  ::end((map<COutPoint,_wallet::PreselectedInput,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_wallet::PreselectedInput>_>_>
         *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  bVar2 = std::operator==(in_RDI,(_Self *)CONCAT17(in_stack_ffffffffffffffc7,
                                                   in_stack_ffffffffffffffc0));
  local_29 = false;
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    std::_Rb_tree_const_iterator<std::pair<const_COutPoint,_wallet::PreselectedInput>_>::operator->
              ((_Rb_tree_const_iterator<std::pair<const_COutPoint,_wallet::PreselectedInput>_> *)
               in_stack_ffffffffffffffb8);
    local_29 = PreselectedInput::HasTxOut(in_stack_ffffffffffffffb8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_29;
}

Assistant:

bool CCoinControl::IsExternalSelected(const COutPoint& outpoint) const
{
    const auto it = m_selected.find(outpoint);
    return it != m_selected.end() && it->second.HasTxOut();
}